

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O2

int Ssw_ManSweepConstr(Ssw_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  abctime aVar2;
  Aig_Man_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  abctime aVar7;
  Bar_Progress_t *p_01;
  Aig_Obj_t *p1;
  ulong uVar8;
  Aig_Man_t *pAVar9;
  char *pString;
  Ssw_Man_t *pSVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  
  aVar2 = Abc_Clock();
  pAVar3 = Ssw_FramesWithClasses(p);
  p->pFrames = pAVar3;
  uVar12 = pAVar3->nObjs[3] - p->pAig->nRegs;
  if ((uVar12 & 1) != 0) {
    __assert_fail("(nConstrPairs & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,0x279,"int Ssw_ManSweepConstr(Ssw_Man_t *)");
  }
  for (iVar13 = 0; iVar13 < (int)uVar12; iVar13 = iVar13 + 2) {
    pAVar4 = Aig_ManCo(p->pFrames,iVar13);
    pAVar5 = Aig_ManCo(p->pFrames,iVar13 + 1);
    Ssw_NodesAreConstrained(p,pAVar4->pFanin0,pAVar5->pFanin0);
  }
  for (iVar13 = 0; pAVar3 = p->pAig, iVar13 < pAVar3->nRegs; iVar13 = iVar13 + 1) {
    pAVar4 = Aig_ManCo(p->pFrames,uVar12 + iVar13);
    Ssw_CnfNodeAddToSolver(p->pMSat,(Aig_Obj_t *)((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe));
  }
  iVar13 = p->pPars->nFramesK;
  iVar14 = pAVar3->nTruePis * iVar13;
  pAVar9 = (Aig_Man_t *)p->pFrames->pConst1;
  p->pNodeToFrames[pAVar3->pConst1->Id * p->nFrames + iVar13] = (Aig_Obj_t *)pAVar9;
  for (iVar11 = 0; iVar11 < p->pAig->nTruePis; iVar11 = iVar11 + 1) {
    pvVar6 = Vec_PtrEntry(p->pAig->vCis,iVar11);
    pAVar4 = Aig_ObjCreateCi(p->pFrames);
    if (p->vInits == (Vec_Int_t *)0x0) {
      uVar8 = 0;
    }
    else {
      iVar1 = Vec_IntEntry(p->vInits,iVar14);
      uVar8 = (ulong)(iVar1 != 0) << 3;
      iVar14 = iVar14 + 1;
    }
    *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xfffffffffffffff7 | uVar8;
    pAVar9 = (Aig_Man_t *)(long)(*(int *)((long)pvVar6 + 0x24) * p->nFrames + iVar13);
    p->pNodeToFrames[(long)pAVar9] = pAVar4;
  }
  if (p->vInits->nSize != iVar14) {
    __assert_fail("Vec_IntSize(p->vInits) == iLits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,0x292,"int Ssw_ManSweepConstr(Ssw_Man_t *)");
  }
  aVar7 = Abc_Clock();
  p->timeReduce = p->timeReduce + (aVar7 - aVar2);
  for (iVar13 = 0; iVar14 = p->pPars->nFramesK, iVar13 <= iVar14; iVar13 = iVar13 + 1) {
    for (iVar14 = 0; iVar14 < p->pAig->nTruePos; iVar14 = iVar14 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,iVar14);
      uVar12 = p->pAig->nTruePos - p->pAig->nConstrs;
      pAVar9 = (Aig_Man_t *)(ulong)uVar12;
      if ((int)uVar12 <= iVar14) {
        Ssw_FramesWithClasses_rec
                  (p,(Aig_Obj_t *)((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe),iVar13);
        pAVar3 = (Aig_Man_t *)Ssw_ObjChild0Fra(p,pAVar4,iVar13);
        pAVar9 = (Aig_Man_t *)((ulong)p->pFrames->pConst1 ^ 1);
        if (pAVar3 != pAVar9) {
          pAVar5 = Ssw_ObjChild0Fra(p,pAVar4,iVar13);
          if (pAVar5 == p->pFrames->pConst1) {
            __assert_fail("Ssw_ObjChild0Fra(p,pObj,f) != Aig_ManConst1(p->pFrames)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                          ,0x2a0,"int Ssw_ManSweepConstr(Ssw_Man_t *)");
          }
          pSVar10 = p;
          pAVar5 = Ssw_ObjChild0Fra(p,pAVar4,iVar13);
          pAVar9 = p->pFrames;
          if (pAVar5 == pAVar9->pConst1) {
            Abc_Print((int)pSVar10,"Polarity violation.\n");
          }
          else {
            pAVar4 = Ssw_ObjChild0Fra(p,pAVar4,iVar13);
            pAVar9 = p->pFrames;
            Ssw_NodesAreConstrained(p,pAVar4,(Aig_Obj_t *)((ulong)pAVar9->pConst1 ^ 1));
          }
        }
      }
    }
  }
  sat_solver_simplify(p->pMSat->pSat);
  p->fRefined = 0;
  Ssw_ClassesClearRefined(p->ppClasses);
  iVar13 = 0;
  if (p->pPars->fVerbose == 0) {
    p_01 = (Bar_Progress_t *)0x0;
  }
  else {
    p_01 = Bar_ProgressStart(_stdout,p->pAig->vObjs->nSize);
    iVar13 = 0;
  }
  do {
    p_00 = p->pAig->vObjs;
    if (p_00->nSize <= iVar13) {
      if (p->pPars->fVerbose != 0) {
        Bar_ProgressStop(p_01);
      }
      return p->fRefined;
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar13);
    if (pAVar4 != (Aig_Obj_t *)0x0) {
      if (p->pPars->fVerbose != 0) {
        Bar_ProgressUpdate(p_01,iVar13,pString);
      }
      iVar11 = Saig_ObjIsLo(p->pAig,pAVar4);
      if (iVar11 == 0) {
        if ((*(uint *)&pAVar4->field_0x18 & 7) - 7 < 0xfffffffe) goto LAB_004e5362;
        pAVar3 = p->pFrames;
        pAVar5 = Ssw_ObjChild0Fra(p,pAVar4,iVar14);
        p1 = Ssw_ObjChild1Fra(p,pAVar4,iVar14);
        pAVar5 = Aig_And(pAVar3,pAVar5,p1);
        pAVar9 = (Aig_Man_t *)(long)(pAVar4->Id * p->nFrames + iVar14);
        p->pNodeToFrames[(long)pAVar9] = pAVar5;
      }
      uVar12 = Ssw_ManSweepNodeConstr(p,pAVar4,iVar14,(int)pAVar9);
      p->fRefined = p->fRefined | uVar12;
    }
LAB_004e5362:
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

int Ssw_ManSweepConstr( Ssw_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObj2, * pObjNew;
    int nConstrPairs, i, f, iLits;
    abctime clk;
//Ssw_ManPrintPolarity( p->pAig );

    // perform speculative reduction
clk = Abc_Clock();
    // create timeframes
    p->pFrames = Ssw_FramesWithClasses( p );
    // add constants
    nConstrPairs = Aig_ManCoNum(p->pFrames)-Aig_ManRegNum(p->pAig);
    assert( (nConstrPairs & 1) == 0 );
    for ( i = 0; i < nConstrPairs; i += 2 )
    {
        pObj  = Aig_ManCo( p->pFrames, i   );
        pObj2 = Aig_ManCo( p->pFrames, i+1 );
        Ssw_NodesAreConstrained( p, Aig_ObjChild0(pObj), Aig_ObjChild0(pObj2) );
    }
    // build logic cones for register inputs
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        pObj  = Aig_ManCo( p->pFrames, nConstrPairs + i );
        Ssw_CnfNodeAddToSolver( p->pMSat, Aig_ObjFanin0(pObj) );//
    }

    // map constants and PIs of the last frame
    f = p->pPars->nFramesK;
//    iLits = 0;
    iLits = f * Saig_ManPiNum(p->pAig);
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
    {
        pObjNew = Aig_ObjCreateCi(p->pFrames);
        pObjNew->fPhase = (p->vInits != NULL) && Vec_IntEntry(p->vInits, iLits++);
        Ssw_ObjSetFrame( p, pObj, f, pObjNew );
    }
    assert( Vec_IntSize(p->vInits) == iLits );
p->timeReduce += Abc_Clock() - clk;

    // add constraints to all timeframes
    for ( f = 0; f <= p->pPars->nFramesK; f++ )
    {
        Saig_ManForEachPo( p->pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(p->pAig) - Saig_ManConstrNum(p->pAig) )
                continue;
            Ssw_FramesWithClasses_rec( p, Aig_ObjFanin0(pObj), f );
//            if ( Aig_Regular(Ssw_ObjChild0Fra(p,pObj,f)) == Aig_ManConst1(p->pFrames) )
            if ( Ssw_ObjChild0Fra(p,pObj,f) == Aig_ManConst0(p->pFrames) )
                continue;
            assert( Ssw_ObjChild0Fra(p,pObj,f) != Aig_ManConst1(p->pFrames) );
            if ( Ssw_ObjChild0Fra(p,pObj,f) == Aig_ManConst1(p->pFrames) )
            {
                Abc_Print( 1, "Polarity violation.\n" );
                continue;
            }
            Ssw_NodesAreConstrained( p, Ssw_ObjChild0Fra(p,pObj,f), Aig_ManConst0(p->pFrames) );
        }
    }
    f = p->pPars->nFramesK;
    // clean the solver
    sat_solver_simplify( p->pMSat->pSat );


    // sweep internal nodes
    p->fRefined = 0;
    Ssw_ClassesClearRefined( p->ppClasses );
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( p->pPars->fVerbose )
            Bar_ProgressUpdate( pProgress, i, NULL );
        if ( Saig_ObjIsLo(p->pAig, pObj) )
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 0 );
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 0 );
        }
    }
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );
    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    return p->fRefined;
}